

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O1

void __thiscall
LinkParser::parseStatus
          (LinkParser *this,Link *link,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  string *s1;
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  _func_int **pp_Var4;
  InputError *this_00;
  undefined8 uVar5;
  string local_78;
  double local_58;
  double setting;
  undefined1 local_40 [16];
  
  pbVar1 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0x20 < (ulong)((long)(tokenList->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    setting = (double)local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&setting,"OPEN","");
    s1 = pbVar1 + 1;
    bVar3 = Utilities::match(s1,(string *)&setting);
    if ((undefined1 *)setting != local_40) {
      operator_delete((void *)setting);
    }
    if (bVar3) {
      pp_Var4 = (link->super_Element)._vptr_Element;
      uVar5 = 1;
    }
    else {
      setting = (double)local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&setting,"CLOSED","");
      bVar3 = Utilities::match(s1,(string *)&setting);
      if ((undefined1 *)setting != local_40) {
        operator_delete((void *)setting);
      }
      if (!bVar3) {
        bVar3 = Utilities::parseNumber<double>(s1,&local_58);
        if (bVar3) {
          (*(link->super_Element)._vptr_Element[0xb])(local_58,link);
          return;
        }
        this_00 = (InputError *)__cxa_allocate_exception(0x30);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        pcVar2 = pbVar1[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
        InputError::InputError(this_00,3,&local_78);
        __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
      }
      pp_Var4 = (link->super_Element)._vptr_Element;
      uVar5 = 0;
    }
    (*pp_Var4[10])(link,uVar5);
  }
  return;
}

Assistant:

void LinkParser::parseStatus(Link* link, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - link ID
    // 1 - OPEN/CLOSED keyword or numerical setting

    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];
    double setting;

    // ... check for OPEN/CLOSED keywords

    if (Utilities::match(tokens[1], "OPEN"))
    {
	    link->setInitStatus(Link::LINK_OPEN);
    }
    else if (Utilities::match(tokens[1], "CLOSED"))
    {
	    link->setInitStatus(Link::LINK_CLOSED);
    }

    // ... check for numerical setting value

    else if (Utilities::parseNumber(tokens[1], setting))
    {
	    link->setInitSetting(setting);
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
}